

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::iterate(LongShaderCompileStressCase *this)

{
  undefined4 shaderType_;
  TestLog *log_00;
  char *__s;
  RenderContext *renderCtx;
  TestLog *siglen;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  undefined1 local_248 [8];
  ShaderProgram program;
  string local_170;
  ShaderSource local_150;
  ShaderSource local_118;
  undefined1 local_f0 [8];
  ProgramSources sources;
  ShaderType otherShader;
  TestLog *log;
  LongShaderCompileStressCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  sources._204_4_ = ZEXT14(this->m_shaderType == SHADERTYPE_VERTEX);
  siglen = log_00;
  glu::ProgramSources::ProgramSources((ProgramSources *)local_f0);
  Stress::anon_unknown_0::LongShaderGenerator::getSource(&local_118,&this->m_gen);
  glu::ProgramSources::operator<<((ProgramSources *)local_f0,&local_118);
  glu::ShaderSource::~ShaderSource(&local_118);
  shaderType_ = sources._204_4_;
  __s = Stress::anon_unknown_0::getConstShaderSource(sources._204_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,__s,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  glu::ShaderSource::ShaderSource(&local_150,shaderType_,&local_170);
  glu::ProgramSources::operator<<((ProgramSources *)local_f0,&local_150);
  glu::ShaderSource::~ShaderSource(&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_248,renderCtx,(ProgramSources *)local_f0)
  ;
  verify(this,(EVP_PKEY_CTX *)local_248,sig,(size_t)siglen,in_R8,in_R9);
  glu::operator<<(log_00,(ShaderProgram *)local_248);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_248);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_f0);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult LongShaderCompileStressCase::iterate (void)
{
	tcu::TestLog&				log			= m_testCtx.getLog();
	const glu::ShaderType		otherShader	= (m_shaderType == glu::SHADERTYPE_VERTEX) ? glu::SHADERTYPE_FRAGMENT : glu::SHADERTYPE_VERTEX;
	glu::ProgramSources			sources;

	sources << m_gen.getSource();
	sources << glu::ShaderSource(otherShader, getConstShaderSource(otherShader));

	{
		glu::ShaderProgram program(m_context.getRenderContext(), sources);

		verify(program);

		log << program;
	}

	return STOP;
}